

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O1

DomObjectHashConstIt<DomButtonGroup> __thiscall
Driver::findByAttributeNameIt<DomButtonGroup>
          (Driver *this,DomObjectHash<DomButtonGroup> *domHash,QString *name)

{
  undefined8 *puVar1;
  QArrayData *pQVar2;
  storage_type_conflict *psVar3;
  long lVar4;
  long lVar5;
  char cVar6;
  Data *pDVar7;
  Data *pDVar8;
  ulong uVar9;
  ulong uVar10;
  QStringView QVar11;
  DomObjectHashConstIt<DomButtonGroup> DVar12;
  QStringView QVar13;
  
  pDVar8 = domHash->d;
  if (pDVar8 == (Data *)0x0) {
    pDVar8 = (Data *)0x0;
  }
  else if (pDVar8->spans->offsets[0] == 0xff) {
    uVar10 = 1;
    do {
      uVar9 = uVar10;
      if (pDVar8->numBuckets == uVar9) {
        pDVar8 = (Data *)0x0;
        uVar9 = 0;
        break;
      }
      uVar10 = uVar9 + 1;
    } while (pDVar8->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    goto LAB_0014b3f0;
  }
  uVar9 = 0;
LAB_0014b3f0:
  pDVar7 = (Data *)0x0;
  uVar10 = 0;
  if (uVar9 != 0 || pDVar8 != (Data *)0x0) {
    pDVar7 = pDVar8;
    do {
      puVar1 = *(undefined8 **)
                pDVar7->spans[uVar9 >> 7].entries
                [pDVar7->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f]].storage.data;
      pQVar2 = (QArrayData *)*puVar1;
      psVar3 = (storage_type_conflict *)puVar1[1];
      lVar4 = puVar1[2];
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar5 = (name->d).size;
      if (lVar4 == lVar5) {
        QVar11.m_data = (name->d).ptr;
        QVar11.m_size = lVar5;
        QVar13.m_data = psVar3;
        QVar13.m_size = lVar4;
        cVar6 = QtPrivate::equalStrings(QVar13,QVar11);
      }
      else {
        cVar6 = '\0';
      }
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      uVar10 = uVar9;
      if (cVar6 != '\0') goto LAB_0014b4d4;
      do {
        if (pDVar7->numBuckets - 1 == uVar9) {
          uVar9 = 0;
          pDVar7 = (Data *)0x0;
          break;
        }
        uVar9 = uVar9 + 1;
      } while (pDVar7->spans[uVar9 >> 7].offsets[(uint)uVar9 & 0x7f] == 0xff);
    } while (uVar9 != 0 || pDVar7 != (Data *)0x0);
    pDVar7 = (Data *)0x0;
    uVar10 = 0;
  }
LAB_0014b4d4:
  DVar12.i.bucket = uVar10;
  DVar12.i.d = pDVar7;
  return (DomObjectHashConstIt<DomButtonGroup>)DVar12.i;
}

Assistant:

Driver::DomObjectHashConstIt<DomClass>
    Driver::findByAttributeNameIt(const DomObjectHash<DomClass> &domHash,
                                  const QString &name) const
{
    const auto end = domHash.cend();
    for (auto it = domHash.cbegin(); it != end; ++it) {
        if (it.key()->attributeName() == name)
            return it;
    }
    return end;
}